

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

void ctr_transform(ptls_cipher_context_t *_ctx,void *output,void *input,size_t len)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [16];
  uint8_t buf [16];
  undefined1 local_18 [16];
  
  if ((len < 0x11) && (*(char *)&_ctx[0x11].do_init != '\0')) {
    *(undefined1 *)&_ctx[0x11].do_init = 0;
    auVar1._0_8_ = _ctx[0x11].algo;
    auVar1._8_8_ = _ctx[0x11].do_dispose;
    if (len < 0x10) {
      uVar2 = (ulong)((uint)input & 0xfff);
      if ((uVar2 < 0xff1) || (0x1000 < uVar2 + len)) {
        auVar3 = *input;
      }
      else {
        auVar3 = vpshufb_avx(*(undefined1 (*) [16])((ulong)input & 0xfffffffffffffff0),
                             *(undefined1 (*) [16])("" + ((uint)input & 0xf)));
      }
      local_18 = vpand_avx(auVar3,*(undefined1 (*) [16])(loadn_mask + (0x20 - len)));
      local_18 = local_18 ^ auVar1;
      if (len != 0) {
        memcpy(output,local_18,len);
      }
    }
    else {
      *(undefined1 (*) [16])output = auVar1 ^ *input;
    }
    return;
  }
  __assert_fail("(ctx->is_ready && len <= 16) || !\"CTR transfomation is supported only once per call to `init` and the maximum size is limited  to 16 bytes\""
                ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/fusion.c",
                0x42d,"void ctr_transform(ptls_cipher_context_t *, void *, const void *, size_t)");
}

Assistant:

static void ctr_transform(ptls_cipher_context_t *_ctx, void *output, const void *input, size_t len)
{
    struct ctr_context *ctx = (struct ctr_context *)_ctx;

    assert((ctx->is_ready && len <= 16) ||
           !"CTR transfomation is supported only once per call to `init` and the maximum size is limited  to 16 bytes");
    ctx->is_ready = 0;

    if (len < 16) {
        storen128(output, len, _mm_xor_si128(_mm_loadu_si128(&ctx->bits), loadn128(input, len)));
    } else {
        _mm_storeu_si128(output, _mm_xor_si128(_mm_loadu_si128(&ctx->bits), _mm_loadu_si128(input)));
    }
}